

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O1

void __thiscall
capnp::
CallContext<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyParams,_capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults>
::setPipeline(CallContext<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyParams,_capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults>
              *this,Pipeline *pipeline)

{
  CallContextHook *pCVar1;
  PipelineHook *pPVar2;
  Disposer *local_18;
  PipelineHook *local_10;
  
  pCVar1 = this->hook;
  local_18 = (pipeline->_typeless).hook.disposer;
  local_10 = (pipeline->_typeless).hook.ptr;
  (pipeline->_typeless).hook.ptr = (PipelineHook *)0x0;
  (*pCVar1->_vptr_CallContextHook[4])(pCVar1,&local_18);
  pPVar2 = local_10;
  if (local_10 != (PipelineHook *)0x0) {
    local_10 = (PipelineHook *)0x0;
    (**local_18->_vptr_Disposer)
              (local_18,pPVar2->_vptr_PipelineHook[-2] + (long)&pPVar2->_vptr_PipelineHook);
  }
  return;
}

Assistant:

void CallContext<Params, Results>::setPipeline(typename Results::Pipeline&& pipeline) {
  hook->setPipeline(PipelineHook::from(kj::mv(pipeline)));
}